

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exefilter.hpp
# Opt level: O1

streamsize __thiscall
stream::inno_exe_decoder_5200::
read<boost::iostreams::detail::linked_streambuf<char,std::char_traits<char>>>
          (inno_exe_decoder_5200 *this,linked_streambuf<char,_std::char_traits<char>_> *src,
          char *dest,streamsize n)

{
  int8_t *piVar1;
  uint8_t *__dest;
  uint8_t *puVar2;
  byte bVar3;
  byte *pbVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  uint32_t uVar10;
  uint uVar11;
  long lVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  uint8_t *unaff_R15;
  
  puVar16 = (uint8_t *)dest;
  if ('\0' < this->flush_bytes) {
    puVar16 = (uint8_t *)0x0;
    do {
      unaff_R15 = puVar16;
      if ((uint8_t *)n == unaff_R15) {
        memmove(this->buffer,this->buffer + n,(long)this->flush_bytes);
        puVar16 = unaff_R15;
        break;
      }
      puVar16 = unaff_R15 + 1;
      dest[(long)unaff_R15] = this->buffer[(long)unaff_R15];
      piVar1 = &this->flush_bytes;
      *piVar1 = *piVar1 + -1;
    } while (*piVar1 != '\0');
    puVar16 = puVar16 + (long)dest;
    if ((uint8_t *)n == unaff_R15) {
      return (streamsize)unaff_R15;
    }
  }
  puVar2 = (uint8_t *)(dest + n);
  if (puVar16 != puVar2) {
    __dest = this->buffer;
    do {
      if (this->flush_bytes == '\0') {
        pbVar4 = *(byte **)&src->field_0x10;
        if (pbVar4 < *(byte **)&src->field_0x18) {
          uVar11 = (uint)*pbVar4;
          *(byte **)&src->field_0x10 = pbVar4 + 1;
        }
        else {
          uVar11 = (**(code **)(*(long *)src + 0x50))(src);
        }
        uVar9 = src->flags_ | 0xfffffffe;
        if (uVar11 != 0xffffffff) {
          uVar9 = uVar11;
        }
        if (uVar9 == 0xfffffffe) {
          unaff_R15 = puVar16 + (n - (long)puVar2);
LAB_0014debf:
          iVar7 = 1;
        }
        else {
          if (uVar9 == 0xffffffff) {
            unaff_R15 = (uint8_t *)
                        (-(ulong)(puVar16 + (n - (long)puVar2) == (uint8_t *)0x0) |
                        (ulong)(puVar16 + (n - (long)puVar2)));
            goto LAB_0014debf;
          }
          *puVar16 = (uint8_t)uVar9;
          puVar16 = puVar16 + 1;
          uVar11 = this->offset;
          this->offset = uVar11 + 1;
          iVar7 = 4;
          if ((~uVar11 & 0xfffc) != 0 && 0xfffffffd < uVar9 - 0xea) {
            this->flush_bytes = -4;
            iVar7 = 0;
          }
        }
        if (iVar7 == 0) goto LAB_0014ded6;
        if (iVar7 != 4) {
          return (streamsize)unaff_R15;
        }
      }
      else {
LAB_0014ded6:
        lVar8 = (**(code **)(*(long *)src + 0x40))
                          (src,this->buffer + (long)this->flush_bytes + 4,-(long)this->flush_bytes);
        lVar12 = -(ulong)(src->flags_ & 1);
        if (lVar8 != 0) {
          lVar12 = lVar8;
        }
        if (lVar12 == -1) {
          cVar6 = this->flush_bytes + '\x04';
          if ('\0' < cVar6) {
            this->flush_bytes = cVar6;
            puVar13 = puVar16 + -(long)dest;
            puVar14 = __dest;
            do {
              puVar15 = puVar16;
              if (puVar15 == puVar2) {
                memmove(__dest,puVar14,(long)this->flush_bytes);
                unaff_R15 = puVar13;
                puVar16 = puVar15;
                break;
              }
              puVar16 = puVar15 + 1;
              *puVar15 = *puVar14;
              puVar13 = puVar13 + 1;
              puVar14 = puVar14 + 1;
              piVar1 = &this->flush_bytes;
              *piVar1 = *piVar1 + -1;
            } while (*piVar1 != '\0');
            if (puVar15 == puVar2) {
              bVar5 = false;
              goto LAB_0014e069;
            }
          }
          bVar5 = false;
          unaff_R15 = (uint8_t *)
                      (-(ulong)(puVar16 + (n - (long)puVar2) == (uint8_t *)0x0) |
                      (ulong)(puVar16 + (n - (long)puVar2)));
        }
        else {
          uVar10 = (int)lVar12 + this->offset;
          cVar6 = this->flush_bytes + (char)lVar12;
          this->flush_bytes = cVar6;
          this->offset = uVar10;
          if (cVar6 == '\0') {
            bVar3 = this->buffer[3];
            if ((bVar3 == 0xff) || (bVar3 == 0)) {
              uVar11 = *(uint3 *)this->buffer - uVar10;
              this->buffer[0] = (uint8_t)uVar11;
              this->buffer[1] = (uint8_t)(uVar11 >> 8);
              this->buffer[2] = (uint8_t)(uVar11 >> 0x10);
              if ((this->flip_high_byte == true) && ((uVar11 & 0x800000) != 0)) {
                this->buffer[3] = ~bVar3;
              }
            }
            this->flush_bytes = '\x04';
            puVar13 = puVar16 + -(long)dest;
            puVar14 = __dest;
            do {
              if (puVar16 == puVar2) {
                memmove(__dest,puVar14,(long)this->flush_bytes);
                unaff_R15 = puVar13;
                goto LAB_0014e067;
              }
              *puVar16 = *puVar14;
              puVar16 = puVar16 + 1;
              puVar13 = puVar13 + 1;
              puVar14 = puVar14 + 1;
              piVar1 = &this->flush_bytes;
              *piVar1 = *piVar1 + -1;
            } while (*piVar1 != '\0');
            bVar5 = true;
          }
          else {
            unaff_R15 = puVar16 + (n - (long)puVar2);
LAB_0014e067:
            bVar5 = false;
          }
        }
LAB_0014e069:
        if (!bVar5) {
          return (streamsize)unaff_R15;
        }
      }
    } while (puVar16 != puVar2);
  }
  return (streamsize)(puVar16 + (n - (long)puVar2));
}

Assistant:

std::streamsize inno_exe_decoder_5200::read(Source & src, char * dest, std::streamsize n) {
	
	char * end = dest + n;
	
	//! Total number of filtered bytes read and written to dest.
#define total_read     (n - (end - dest))
	
#define flush(N) \
	{ \
		if((N) > 0) { \
			flush_bytes = (N); \
			size_t buffer_i = 0; \
			do { \
				if(dest == end) { \
					memmove(buffer, buffer + buffer_i, size_t(flush_bytes)); \
					return total_read; \
				} \
				*dest++ = char(buffer[buffer_i++]); \
			} while(--flush_bytes); \
		} \
	} (void)0
	
	
	// Flush already processed address bytes.
	flush(flush_bytes);
	
	while(dest != end) {
		
		if(!flush_bytes) {
			
			// Check if this is a CALL or JMP instruction.
			int byte = boost::iostreams::get(src);
			if(byte == EOF) { return total_read ? total_read : EOF; }
			if(byte == boost::iostreams::WOULD_BLOCK) { return total_read; }
			*dest++ = char(byte);
			offset++;
			if(byte != 0xe8 && byte != 0xe9) {
				// Not a CALL or JMP instruction.
				continue;
			}
			
			const size_t block_size_left = block_size - ((offset - 1) % block_size);
			if(block_size_left < 5) {
				// Ignore instructions that span blocks.
				continue;
			}
			
			flush_bytes = -4;
		}
		
		assert(flush_bytes < 0);
		
		// Read all four address bytes.
		char * dst = reinterpret_cast<char *>(buffer + 4 + flush_bytes);
		std::streamsize nread = boost::iostreams::read(src, dst, -flush_bytes);
		if(nread == EOF) {
			flush(boost::int8_t(4 + flush_bytes));
			return total_read ? total_read : EOF;
		}
		flush_bytes = boost::int8_t(flush_bytes + nread), offset += boost::uint32_t(nread);
		if(flush_bytes) { return total_read; }
		
		// Verify that the high byte of the address is 0x00 or 00xff.
		if(buffer[3] == 0x00 || buffer[3] == 0xff) {
			
			boost::uint32_t addr = offset & 0xffffff; // may wrap, but OK
			
			boost::uint32_t rel = buffer[0] | (boost::uint32_t(buffer[1]) << 8)
			                                | (boost::uint32_t(buffer[2]) << 16);
			rel -= addr;
			buffer[0] = boost::uint8_t(rel);
			buffer[1] = boost::uint8_t(rel >> 8);
			buffer[2] = boost::uint8_t(rel >> 16);
			
			if(flip_high_byte) {
				// For a slightly higher compression ratio, we want the resulting high
				// byte to be 0x00 for both forward and backward jumps. The high byte
				// of the original relative address is likely to be the sign extension
				// of bit 23, so if bit 23 is set, toggle all bits in the high byte.
				if(rel & 0x800000) {
					buffer[3] = boost::uint8_t(~buffer[3]);
				}
			}
			
		} else {
			// This is most likely not a CALL or JUMP.
		}
		
		flush(4);
	}
	
	return total_read;
	
#undef flush
#undef total_read
	
}